

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

Identifier __thiscall soul::heart::Parser::parseBlockName(Parser *this)

{
  Identifier IVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  CompileMessage local_40;
  
  std::__cxx11::string::string
            ((string *)&local_60,
             (string *)
             &(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).currentStringValue);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x2a3326);
  if (local_60._M_string_length < 2) {
    Errors::invalidBlockName<std::__cxx11::string&>(&local_40,(Errors *)&local_60,args);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_40);
    CompileMessage::~CompileMessage(&local_40);
  }
  IVar1 = Allocator::get<std::__cxx11::string>(&((this->program).pimpl)->allocator,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return (Identifier)IVar1.name;
}

Assistant:

Identifier parseBlockName()
    {
        auto name = currentStringValue;
        expect (Token::blockIdentifier);

        if (name.length() < 2)
            throwError (Errors::invalidBlockName (name));

        return program.getAllocator().get (name);
    }